

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> *
__thiscall
sf::String::toUtf8_abi_cxx11_
          (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           *__return_storage_ptr__,String *this)

{
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  begin;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  reserve(__return_storage_ptr__,(this->m_string)._M_string_length);
  begin._M_current = (this->m_string)._M_dataplus._M_p;
  Utf<32u>::
  toUtf8<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
            (begin,(__normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                    )(begin._M_current + (this->m_string)._M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Uint8> String::toUtf8() const
{
    // Prepare the output string
    std::basic_string<Uint8> output;
    output.reserve(m_string.length());

    // Convert
    Utf32::toUtf8(m_string.begin(), m_string.end(), std::back_inserter(output));

    return output;
}